

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

uint64_t extract_pkg_name(char *path)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar2 = strlen(path);
  sVar3 = strlen(path);
  uVar5 = ((int)(uint)sVar3 >> 0x1f & (uint)sVar3) - 1;
  uVar6 = sVar3 & 0xffffffff;
  sVar8 = sVar3;
  do {
    sVar8 = sVar8 - 1;
    sVar9 = sVar3;
    uVar4 = uVar5;
    if ((int)uVar6 < 1) break;
    uVar4 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar4;
  } while (path[sVar8 & 0xffffffff] != '/');
  do {
    sVar9 = sVar9 - 1;
    uVar1 = uVar5;
    if ((int)sVar3 < 1) break;
    uVar1 = (int)sVar3 - 1;
    sVar3 = (size_t)uVar1;
  } while (path[sVar9 & 0xffffffff] != '.');
  uVar5 = 0xffffffff;
  if ((int)uVar4 <= (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar7 = uVar5;
  if (uVar4 == 0xffffffff) {
    uVar7 = uVar1;
  }
  if ((uVar4 & uVar7) != 0xffffffff) {
    if (uVar4 != 0xffffffff) {
      sVar8 = (long)(int)uVar5;
      if (uVar7 == 0xffffffff) {
        sVar8 = sVar2;
      }
      uVar6 = sVar8 - (long)(int)uVar4;
      if (uVar6 < 2) {
        return 0xffffffffffffffff;
      }
      sVar2 = uVar6 - 1;
      path = path + (long)(int)uVar4 + 1;
      goto LAB_00112dc9;
    }
    sVar2 = (size_t)(int)uVar1;
  }
  if (sVar2 == 0) {
    return 0;
  }
LAB_00112dc9:
  sVar8 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 * 0x100000001b3 ^ (ulong)(byte)path[sVar8];
    sVar8 = sVar8 + 1;
  } while (sVar2 != sVar8);
  return uVar6;
}

Assistant:

uint64_t extract_pkg_name(char *path) {
	// Find the last path component
	size_t length = strlen(path);
	int last_path = rfind(path, '/');

	// Find the last `.` for the file extension
	int last_dot = rfind(path, '.');
	if (last_path != -1 && last_dot < last_path) {
		// The dot is before the final path component, so there's no file
		// extension
		last_dot = -1;
	}

	char *start;
	size_t actual_length;
	if (last_path == -1 && last_dot == -1) {
		// No path components and no file extension, the path itself is the name
		start = path;
		actual_length = length;
	} else if (last_path == -1) {
		// File extension, but no path components
		start = path;
		actual_length = (size_t) last_dot;
	} else {
		// Stop before the file extension if one exists
		size_t stop = length;
		if (last_dot != -1) {
			stop = (size_t) last_dot;
		}

		// Extract the last component into a new string
		if (stop - last_path <= 1) {
			return ~((uint64_t) 0);
		}
		start = &path[last_path + 1];
		actual_length = stop - last_path - 1;
	}

	return hash_string(start, actual_length);
}